

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O1

void __thiscall
QFutureInterfaceBase::setProgressRange(QFutureInterfaceBase *this,int minimum,int maximum)

{
  __pointer_type copy;
  QFutureInterfaceBasePrivate *this_00;
  QFutureInterfaceBasePrivate *pQVar1;
  ProgressData *pPVar2;
  int iVar3;
  int i;
  ulong uVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QFutureCallOutEvent local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->d;
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    if ((((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
        (__pointer_type)0x0) {
      LOCK();
      bVar5 = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
              (__pointer_type)0x0;
      if (bVar5) {
        (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
             (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar5) goto LAB_001ef2ad;
    }
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
LAB_001ef2ad:
  pQVar1 = this->d;
  if ((pQVar1->m_progress).d == (ProgressData *)0x0) {
    pPVar2 = (ProgressData *)operator_new(0x20);
    (pPVar2->text).d.ptr = (char16_t *)0x0;
    (pPVar2->text).d.size = 0;
    pPVar2->minimum = 0;
    pPVar2->maximum = 0;
    (pPVar2->text).d.d = (Data *)0x0;
    QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
    ::reset(&pQVar1->m_progress,pPVar2);
  }
  pQVar1 = this->d;
  pPVar2 = (pQVar1->m_progress).d;
  pPVar2->minimum = minimum;
  iVar3 = maximum;
  if (maximum < minimum) {
    iVar3 = minimum;
  }
  pPVar2->maximum = iVar3;
  QEvent::QEvent(&local_70.super_QEvent,FutureCallOut);
  local_70.super_QEvent._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_006af620;
  local_70.callOutType = ProgressRange;
  local_70.text.d.size = 0;
  local_70.text.d.d = (Data *)0x0;
  local_70.text.d.ptr = (char16_t *)0x0;
  local_70.index1 = minimum;
  local_70.index2 = maximum;
  if ((pQVar1->outputConnections).d.size != 0) {
    uVar4 = 0;
    do {
      (*(pQVar1->outputConnections).d.ptr[uVar4]->_vptr_QFutureCallOutInterface[2])();
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)(pQVar1->outputConnections).d.size);
  }
  QFutureCallOutEvent::~QFutureCallOutEvent(&local_70);
  this->d->m_progressValue = minimum;
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    LOCK();
    copy = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p;
    (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
         (__pointer_type)0x0;
    UNLOCK();
    if (copy != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::setProgressRange(int minimum, int maximum)
{
    QMutexLocker locker(&d->m_mutex);
    if (!d->m_progress)
        d->m_progress.reset(new QFutureInterfaceBasePrivate::ProgressData());
    d->m_progress->minimum = minimum;
    d->m_progress->maximum = qMax(minimum, maximum);
    d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::ProgressRange, minimum, maximum));
    d->m_progressValue = minimum;
}